

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O1

void __thiscall
cm::uv_handle_ptr_base_<uv_handle_s>::allocate(uv_handle_ptr_base_<uv_handle_s> *this,void *data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar1;
  
  this_00 = (this->handle).super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->handle).super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->handle).super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pvVar1 = calloc(1,0x60);
  std::__shared_ptr<uv_handle_s,(__gnu_cxx::_Lock_policy)2>::
  reset<uv_handle_s,cm::uv_handle_deleter<uv_handle_s>>
            ((__shared_ptr<uv_handle_s,(__gnu_cxx::_Lock_policy)2> *)this,pvVar1);
  ((this->handle).super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data = data;
  return;
}

Assistant:

void uv_handle_ptr_base_<T>::allocate(void* data)
{
  reset();

  /*
    We use calloc since we know all these types are c structs
    and we just want to 0 init them. New would do the same thing;
    but casting from uv_handle_t to certain other types -- namely
    uv_timer_t -- triggers a cast_align warning on certain systems.
  */
  handle.reset(static_cast<T*>(calloc(1, sizeof(T))), uv_handle_deleter<T>());
  handle->data = data;
}